

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O3

vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *
pbrt::ComputeRadicalInversePermutations(uint32_t seed,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> *perms;
  vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
  *local_78;
  void *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  memory_resource *local_30;
  
  local_30 = alloc.memoryResource;
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x20,8);
  local_78 = (vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
              *)CONCAT44(extraout_var,iVar1);
  (local_78->alloc).memoryResource = alloc.memoryResource;
  local_78->nStored = 0;
  local_78->ptr = (DigitPermutation *)0x0;
  local_78->nAlloc = 0;
  pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>::
  resize(local_78,1000);
  local_68 = 0;
  local_70 = operator_new(0x18);
  *(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_> ***)
   local_70 = &local_78;
  *(memory_resource ***)((long)local_70 + 8) = &local_30;
  *(uint32_t *)((long)local_70 + 0x10) = seed;
  local_58 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp:130:36)>
             ::_M_manager;
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(long,_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/parallel.h:166:29)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_70;
  ParallelFor(0,1000,(function<void_(long,_long)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,3);
  }
  return local_78;
}

Assistant:

pstd::vector<DigitPermutation> *ComputeRadicalInversePermutations(uint32_t seed,
                                                                  Allocator alloc) {
    pstd::vector<DigitPermutation> *perms =
        alloc.new_object<pstd::vector<DigitPermutation>>(alloc);
    perms->resize(PrimeTableSize);
    ParallelFor(0, PrimeTableSize, [&perms, &alloc, seed](int64_t i) {
        (*perms)[i] = DigitPermutation(Primes[i], seed, alloc);
    });
    return perms;
}